

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O1

void errorlimit(FuncState *fs,int limit,char *what)

{
  lua_State *L;
  char *pcVar1;
  
  L = fs->ls->L;
  if (fs->f->linedefined == 0) {
    pcVar1 = "main function";
  }
  else {
    pcVar1 = luaO_pushfstring(L,"function at line %d");
  }
  pcVar1 = luaO_pushfstring(L,"too many %s (limit is %d) in %s",what,limit,pcVar1);
  luaX_syntaxerror(fs->ls,pcVar1);
}

Assistant:

static l_noret errorlimit(FuncState *fs, int limit, const char *what) {
    lua_State *L = fs->ls->L;
    const char *msg;
    int line = fs->f->linedefined;
    const char *where = (line == 0)
                        ? "main function"
                        : luaO_pushfstring(L, "function at line %d", line);
    msg = luaO_pushfstring(L, "too many %s (limit is %d) in %s",
                           what, limit, where);
    luaX_syntaxerror(fs->ls, msg);
}